

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_carith.c
# Opt level: O3

uint64_t lj_carith_powu64(uint64_t x,uint64_t k)

{
  ulong uVar1;
  long lVar2;
  long lVar3;
  
  if (k == 0) {
    return 1;
  }
  uVar1 = k & 1;
  while (uVar1 == 0) {
    x = x * x;
    uVar1 = k & 2;
    k = k >> 1;
  }
  if (1 < k) {
    lVar2 = x * x;
    while (k >> 1 != 1) {
      lVar3 = lVar2;
      if ((k & 2) == 0) {
        lVar3 = 1;
      }
      x = x * lVar3;
      lVar2 = lVar2 * lVar2;
      k = k >> 1;
    }
    x = x * lVar2;
  }
  return x;
}

Assistant:

uint64_t lj_carith_powu64(uint64_t x, uint64_t k)
{
  uint64_t y;
  if (k == 0)
    return 1;
  for (; (k & 1) == 0; k >>= 1) x *= x;
  y = x;
  if ((k >>= 1) != 0) {
    for (;;) {
      x *= x;
      if (k == 1) break;
      if (k & 1) y *= x;
      k >>= 1;
    }
    y *= x;
  }
  return y;
}